

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shape.cpp
# Opt level: O2

void __thiscall sf::Shape::updateOutline(Shape *this)

{
  VertexArray *this_00;
  VertexArray *this_01;
  Vector2f VVar1;
  undefined8 uVar2;
  size_t sVar3;
  Vertex *pVVar4;
  Vertex *pVVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t index;
  bool bVar9;
  uint uVar10;
  uint uVar11;
  float fVar12;
  Vector2f VVar13;
  Vector2f VVar14;
  float fVar17;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar18;
  float fVar19;
  float fVar20;
  FloatRect FVar21;
  Vector2f local_e8;
  uint uStack_e0;
  uint uStack_dc;
  Vector2f p2;
  Vector2f p1;
  Vector2f p0;
  float local_b8;
  float fStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  float local_a8;
  float local_98;
  float local_48;
  float fStack_44;
  
  if ((this->m_outlineThickness != 0.0) || (NAN(this->m_outlineThickness))) {
    this_00 = &this->m_vertices;
    sVar3 = VertexArray::getVertexCount(this_00);
    this_01 = &this->m_outlineVertices;
    sVar6 = sVar3 - 2;
    VertexArray::resize(this_01,sVar3 * 2 - 2);
    sVar3 = 1;
    sVar7 = sVar6;
    sVar8 = 0;
    while (bVar9 = sVar7 != 0, sVar7 = sVar7 - 1, bVar9) {
      index = sVar8;
      if (sVar8 == 0) {
        index = sVar6;
      }
      pVVar4 = VertexArray::operator[](this_00,index);
      p0 = pVVar4->position;
      pVVar4 = VertexArray::operator[](this_00,sVar8 + 1);
      VVar1 = pVVar4->position;
      p1 = VVar1;
      pVVar4 = VertexArray::operator[](this_00,sVar8 + 2);
      p2 = pVVar4->position;
      VVar13 = anon_unknown.dwarf_21233a::computeNormal(&p0,&p1);
      VVar14 = anon_unknown.dwarf_21233a::computeNormal(&p1,&p2);
      pVVar4 = VertexArray::operator[](this_00,0);
      local_e8.x = VVar13.x;
      local_e8.y = VVar13.y;
      uStack_e0 = (uint)extraout_XMM0_Qb;
      uStack_dc = (uint)((ulong)extraout_XMM0_Qb >> 0x20);
      fVar12 = (pVVar4->position).x;
      fVar17 = (pVVar4->position).y;
      pVVar4 = VertexArray::operator[](this_00,0);
      VVar13 = pVVar4->position;
      uVar2 = *(undefined8 *)&(pVVar4->position).y;
      local_b8 = VVar14.x;
      fStack_b4 = VVar14.y;
      uStack_b0 = (uint)extraout_XMM0_Qb_00;
      uStack_ac = (uint)((ulong)extraout_XMM0_Qb_00 >> 0x20);
      pVVar4 = VertexArray::operator[](this_01,sVar3 - 1);
      pVVar4->position = VVar1;
      local_a8 = VVar13.x;
      local_48 = VVar1.x;
      fStack_44 = VVar1.y;
      local_98 = (float)uVar2;
      uVar10 = -(uint)(0.0 < local_b8 * (local_a8 - local_48) + fStack_b4 * (local_98 - fStack_44));
      uVar11 = -(uint)(0.0 < local_e8.x * (fVar12 - local_48) + local_e8.y * (fVar17 - fStack_44));
      fVar18 = (float)(~uVar11 & (uint)local_e8.x | (uint)-local_e8.x & uVar11);
      fVar19 = (float)(~uVar11 & (uint)local_e8.y | (uint)-local_e8.y & uVar11);
      fVar12 = (float)(~uVar10 & (uint)local_b8 | (uint)-local_b8 & uVar10);
      fVar17 = (float)(~uVar10 & (uint)fStack_b4 | (uint)-fStack_b4 & uVar10);
      fVar20 = fVar18 * fVar12 + fVar19 * fVar17 + 1.0;
      auVar15._0_4_ = fVar12 + fVar18;
      auVar15._4_4_ = fVar17 + fVar19;
      auVar15._8_4_ =
           (float)(~uVar11 & uStack_b0 | (uStack_b0 ^ 0x80000000) & uVar11) +
           (float)(~uVar11 & uStack_e0 | (uStack_e0 ^ 0x80000000) & uVar11);
      auVar15._12_4_ =
           (float)(~uVar11 & uStack_ac | (uStack_ac ^ 0x80000000) & uVar11) +
           (float)(~uVar11 & uStack_dc | (uStack_dc ^ 0x80000000) & uVar11);
      auVar16._4_4_ = fVar20;
      auVar16._0_4_ = fVar20;
      auVar16._8_4_ = fVar19;
      auVar16._12_4_ = fVar19;
      auVar16 = divps(auVar15,auVar16);
      local_e8.y = this->m_outlineThickness * auVar16._4_4_ + fStack_44;
      local_e8.x = this->m_outlineThickness * auVar16._0_4_ + local_48;
      pVVar4 = VertexArray::operator[](this_01,sVar3);
      pVVar4->position = local_e8;
      sVar3 = sVar3 + 2;
      sVar8 = sVar8 + 1;
    }
    pVVar4 = VertexArray::operator[](this_01,0);
    pVVar5 = VertexArray::operator[](this_01,sVar6 * 2);
    pVVar5->position = pVVar4->position;
    pVVar4 = VertexArray::operator[](this_01,1);
    pVVar5 = VertexArray::operator[](this_01,sVar6 * 2 + 1);
    pVVar5->position = pVVar4->position;
    updateOutlineColors(this);
    FVar21 = VertexArray::getBounds(this_01);
    this->m_bounds = FVar21;
  }
  else {
    VertexArray::clear(&this->m_outlineVertices);
    fVar12 = (this->m_insideBounds).top;
    fVar17 = (this->m_insideBounds).width;
    fVar18 = (this->m_insideBounds).height;
    (this->m_bounds).left = (this->m_insideBounds).left;
    (this->m_bounds).top = fVar12;
    (this->m_bounds).width = fVar17;
    (this->m_bounds).height = fVar18;
  }
  return;
}

Assistant:

void Shape::updateOutline()
{
    // Return if there is no outline
    if (m_outlineThickness == 0.f)
    {
        m_outlineVertices.clear();
        m_bounds = m_insideBounds;
        return;
    }

    std::size_t count = m_vertices.getVertexCount() - 2;
    m_outlineVertices.resize((count + 1) * 2);

    for (std::size_t i = 0; i < count; ++i)
    {
        std::size_t index = i + 1;

        // Get the two segments shared by the current point
        Vector2f p0 = (i == 0) ? m_vertices[count].position : m_vertices[index - 1].position;
        Vector2f p1 = m_vertices[index].position;
        Vector2f p2 = m_vertices[index + 1].position;

        // Compute their normal
        Vector2f n1 = computeNormal(p0, p1);
        Vector2f n2 = computeNormal(p1, p2);

        // Make sure that the normals point towards the outside of the shape
        // (this depends on the order in which the points were defined)
        if (dotProduct(n1, m_vertices[0].position - p1) > 0)
            n1 = -n1;
        if (dotProduct(n2, m_vertices[0].position - p1) > 0)
            n2 = -n2;

        // Combine them to get the extrusion direction
        float factor = 1.f + (n1.x * n2.x + n1.y * n2.y);
        Vector2f normal = (n1 + n2) / factor;

        // Update the outline points
        m_outlineVertices[i * 2 + 0].position = p1;
        m_outlineVertices[i * 2 + 1].position = p1 + normal * m_outlineThickness;
    }

    // Duplicate the first point at the end, to close the outline
    m_outlineVertices[count * 2 + 0].position = m_outlineVertices[0].position;
    m_outlineVertices[count * 2 + 1].position = m_outlineVertices[1].position;

    // Update outline colors
    updateOutlineColors();

    // Update the shape's bounds
    m_bounds = m_outlineVertices.getBounds();
}